

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_chan.c
# Opt level: O0

uint16_t s_chan_get_(s_chan_t *chan,void **out_object,uint16_t *number)

{
  ushort uVar1;
  ushort local_24;
  uint16_t count0;
  uint16_t count;
  uint16_t end;
  uint16_t *number_local;
  void **out_object_local;
  s_chan_t *chan_local;
  
  local_24 = chan->available_count;
  if (*number < local_24) {
    local_24 = *number;
  }
  uVar1 = chan->begin + local_24;
  if (uVar1 < chan->max_count) {
    memcpy(*out_object,
           (uint16_t *)((long)&chan[1].max_count + (ulong)chan->begin * (ulong)chan->element_size),
           (ulong)local_24 * (ulong)chan->element_size);
    *out_object = (void *)((long)*out_object + (ulong)local_24 * (ulong)chan->element_size);
    chan->begin = uVar1;
  }
  else {
    uVar1 = chan->max_count - chan->begin;
    memcpy(*out_object,
           (uint16_t *)((long)&chan[1].max_count + (ulong)chan->begin * (ulong)chan->element_size),
           (ulong)uVar1 * (ulong)chan->element_size);
    *out_object = (void *)((long)*out_object + (ulong)uVar1 * (ulong)chan->element_size);
    uVar1 = local_24 - uVar1;
    memcpy(*out_object,chan + 1,(ulong)uVar1 * (ulong)chan->element_size);
    *out_object = (void *)((long)*out_object + (ulong)uVar1 * (ulong)chan->element_size);
    chan->begin = uVar1;
  }
  chan->available_count = chan->available_count - local_24;
  *number = *number - local_24;
  return local_24;
}

Assistant:

uint16_t s_chan_get_(s_chan_t *chan, void **out_object, uint16_t *number) {
    uint16_t end;
    uint16_t count;
    
    count = chan->available_count;
    if(count > *number)
        count = *number;
    
    end = chan->begin + count;
    if(end >= chan->max_count) {
        uint16_t count0 = chan->max_count - chan->begin;
        memcpy(*out_object, (char *)&chan[1] + chan->begin * (size_t)chan->element_size, count0 * (size_t)chan->element_size);
        *out_object = (void *)((char *)*out_object + count0 * (size_t)chan->element_size);

        count0 = count - count0;
        memcpy(*out_object, (char *)&chan[1], count0 * (size_t)chan->element_size);
        *out_object = (void*)((char*)*out_object + count0 * (size_t)chan->element_size);

        chan->begin = count0;
    }
    else {
        memcpy(*out_object, (char *)&chan[1] + chan->begin * (size_t)chan->element_size, count * (size_t)chan->element_size);
        *out_object = (void*)((char*)*out_object + count * (size_t)chan->element_size);

        chan->begin = end;
    }

    chan->available_count -= count;
    *number -= count;

    return count;
}